

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::EnsureBaseSize
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint inputMax)

{
  JitArenaAllocator *this_00;
  uint **obj;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  uint local_84;
  uint **oldBackingStore;
  uint i_1;
  uint i;
  TrackAllocData local_58;
  uint **local_30;
  uint **tempList;
  uint local_20;
  uint curNumSegments;
  uint newNumSegments;
  uint max;
  uint targetSize;
  uint inputMax_local;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  newNumSegments = inputMax + 1;
  local_84 = newNumSegments;
  if ((newNumSegments & 0xf) != 0) {
    local_84 = (inputMax + 0x11) - (newNumSegments & 0xf);
  }
  curNumSegments = local_84;
  local_20 = local_84 >> 4;
  tempList._4_4_ = this->maxIndex >> 4;
  if (tempList._4_4_ < local_20) {
    this_00 = this->alloc;
    max = inputMax;
    _targetSize = this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&unsigned_int*::typeinfo,0,(ulong)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
               ,0xb1);
    this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,&local_58);
    local_30 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
                         ((Memory *)this_01,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,
                          (ulong)local_20);
    for (oldBackingStore._4_4_ = 0; oldBackingStore._4_4_ < tempList._4_4_;
        oldBackingStore._4_4_ = oldBackingStore._4_4_ + 1) {
      local_30[oldBackingStore._4_4_] = this->backingStore[oldBackingStore._4_4_];
    }
    for (oldBackingStore._0_4_ = tempList._4_4_; (uint)oldBackingStore < local_20;
        oldBackingStore._0_4_ = (uint)oldBackingStore + 1) {
      local_30[(uint)oldBackingStore] = (uint *)0x0;
    }
    this->maxIndex = curNumSegments;
    obj = this->backingStore;
    this->backingStore = local_30;
    Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int*>
              (this->alloc,(ulong)tempList._4_4_,obj);
  }
  return;
}

Assistant:

inline void EnsureBaseSize(indexType inputMax)
    {
        // We want to ensure that we can store to inputMax, which means we need to grow to inputMax+1
        indexType targetSize = inputMax + 1;
        // round up to the next numPerSegment multiple
        indexType max = (targetSize % numPerSegment == 0) ? targetSize : (targetSize + numPerSegment - (targetSize % numPerSegment));
        // get segment counts for allocation
        indexType newNumSegments = max / numPerSegment;
        indexType curNumSegments = maxIndex / numPerSegment;
        if (newNumSegments > curNumSegments)
        {
            // Note that if you want to use this with something other than an ArenaAllocator, then
            // you'll have to add clean-up mechanics
            indexType **tempList = AllocatorNewArray(TAllocator, alloc, indexType*, newNumSegments);
            for (indexType i = 0; i < curNumSegments; i++)
            {
                tempList[i] = backingStore[i];
            }
            for (indexType i = curNumSegments; i < newNumSegments; i++)
            {
                tempList[i] = nullptr;
            }
            // Set the max index to the number of supported indicies
            maxIndex = max;
            // replace the backingStore with the new backing Store
            indexType **oldBackingStore = backingStore;
            backingStore = tempList;
            AllocatorDeleteArray(TAllocator, alloc, curNumSegments, oldBackingStore);
        }
    }